

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::Block::dump_abi_cxx11_(string *__return_storage_ptr__,Block *this,int level)

{
  pointer puVar1;
  Statement *pSVar2;
  ostream *poVar3;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  *statement;
  pointer puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  long local_1c0;
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)level);
  std::operator+(&local_1e0,&local_200,"Block {");
  local_1c0 = (long)level;
  poVar3 = std::operator<<(local_1a8,(string *)&local_1e0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)(level + 1));
  std::operator+(&local_1e0,&local_200,"echoing ");
  poVar3 = std::operator<<(local_1a8,(string *)&local_1e0);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  puVar1 = (this->statements).
           super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->statements).
                super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pSVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Statement_*,_std::default_delete<ninx::parser::element::Statement>_>
             .super__Head_base<0UL,_ninx::parser::element::Statement_*,_false>._M_head_impl;
    (**(code **)((long)(pSVar2->super_ASTElement)._vptr_ASTElement + 0x18))
              (&local_1e0,pSVar2,level + 1);
    poVar3 = std::operator<<(local_1a8,(string *)&local_1e0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)local_1c0);
  std::operator+(&local_1e0,&local_200,"}");
  poVar3 = std::operator<<(local_1a8,(string *)&local_1e0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Block::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "Block {" << std::endl;
    s << std::string(level + 1, '\t') + "echoing " << this->is_echoing() << std::endl;
    for (auto &statement : statements) {
        s << statement->dump(level + 1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}